

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.c
# Opt level: O2

secp256k1_context_struct * wally_internal_secp_context(void)

{
  if (global_ctx != (secp256k1_context *)0x0) {
    return global_ctx;
  }
  global_ctx = wally_get_new_secp_context();
  return global_ctx;
}

Assistant:

struct secp256k1_context_struct *wally_internal_secp_context(void)
{
    /* Default implementation uses a lazy-initialized global context,
     * this should be fetched or set by the caller before any threads
     * are created in order to be thread-safe. */
    if (!global_ctx)
        global_ctx = wally_get_new_secp_context();

    return global_ctx;
}